

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O0

void mk_config_free_all(mk_server *server)

{
  mk_server *server_local;
  
  mk_vhost_free_all(server);
  mk_mimetype_free_all(server);
  if (server->config != (mk_rconf *)0x0) {
    mk_rconf_free(server->config);
  }
  if (server->path_conf_root != (char *)0x0) {
    mk_mem_free(server->path_conf_root);
  }
  if (server->path_conf_pidfile != (char *)0x0) {
    mk_mem_free(server->path_conf_pidfile);
  }
  if (server->conf_user_pub != (char *)0x0) {
    mk_mem_free(server->conf_user_pub);
  }
  if (server->index_files != (mk_list *)0x0) {
    mk_string_split_free(server->index_files);
  }
  if (server->user != (char *)0x0) {
    mk_mem_free(server->user);
  }
  if (server->transport_layer != (char *)0x0) {
    mk_mem_free(server->transport_layer);
  }
  mk_config_listeners_free(server);
  mk_ptr_free(&server->server_software);
  mk_mem_free(server);
  return;
}

Assistant:

void mk_config_free_all(struct mk_server *server)
{
    mk_vhost_free_all(server);
    mk_mimetype_free_all(server);

    if (server->config) {
        mk_rconf_free(server->config);
    }

    if (server->path_conf_root) {
        mk_mem_free(server->path_conf_root);
    }

    if (server->path_conf_pidfile) {
        mk_mem_free(server->path_conf_pidfile);
    }

    if (server->conf_user_pub) {
        mk_mem_free(server->conf_user_pub);
    }

    /* free config->index_files */
    if (server->index_files) {
        mk_string_split_free(server->index_files);
    }

    if (server->user) {
        mk_mem_free(server->user);
    }

    if (server->transport_layer) {
        mk_mem_free(server->transport_layer);
    }

    mk_config_listeners_free(server);

    mk_ptr_free(&server->server_software);
    mk_mem_free(server);
}